

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O0

double __thiscall OpenMD::Vector<double,_3U>::max(Vector<double,_3U> *this)

{
  uint i;
  double val;
  Vector<double,_3U> *this_local;
  
  val = this->data_[0];
  for (i = 0; i < 3; i = i + 1) {
    if (val < this->data_[i]) {
      val = this->data_[i];
    }
  }
  return val;
}

Assistant:

inline Real max() {
      Real val = this->data_[0];
      for (unsigned int i = 0; i < Dim; i++) {
        if (this->data_[i] > val) val = this->data_[i];
      }
      return val;
    }